

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::~RunContext(RunContext *this)

{
  bool bVar1;
  pointer pIVar2;
  undefined1 _aborting;
  RunContext *in_RDI;
  TestRunInfo *this_00;
  undefined7 in_stack_ffffffffffffff50;
  TestRunInfo *in_stack_ffffffffffffff58;
  TestRunStats *in_stack_ffffffffffffff60;
  
  (in_RDI->super_IResultCapture)._vptr_IResultCapture = (_func_int **)&PTR__RunContext_00a1be60;
  (in_RDI->super_IRunner)._vptr_IRunner = (_func_int **)&PTR__RunContext_00a1bf38;
  pIVar2 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       *)0x267bed);
  this_00 = &in_RDI->m_runInfo;
  _aborting = (undefined1)((ulong)&in_RDI->m_totals >> 0x38);
  bVar1 = aborting(in_RDI);
  TestRunStats::TestRunStats
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
             (Totals *)CONCAT17(bVar1,in_stack_ffffffffffffff50),(bool)_aborting);
  (*pIVar2->_vptr_IStreamingReporter[0xe])(pIVar2,&stack0xffffffffffffff58);
  TestRunStats::~TestRunStats((TestRunStats *)in_RDI);
  std::__cxx11::string::~string((string *)&in_RDI->m_skippedTestReason);
  FatalConditionHandler::~FatalConditionHandler((FatalConditionHandler *)in_RDI);
  TestCaseTracking::TrackerContext::~TrackerContext((TrackerContext *)0x267c8e);
  clara::std::
  vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
  ::~vector((vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
             *)this_00);
  clara::std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::~vector
            ((vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_> *)this_00);
  clara::std::vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>::~vector
            ((vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_> *)this_00);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector
            ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)this_00);
  clara::std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
  ::~unique_ptr((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                 *)in_RDI);
  Totals::~Totals((Totals *)0x267cf4);
  clara::std::shared_ptr<const_Catch::IConfig>::~shared_ptr
            ((shared_ptr<const_Catch::IConfig> *)0x267d05);
  Option<Catch::AssertionResult>::~Option((Option<Catch::AssertionResult> *)0x267d13);
  TestRunInfo::~TestRunInfo((TestRunInfo *)0x267d21);
  IRunner::~IRunner(&in_RDI->super_IRunner);
  IResultCapture::~IResultCapture(&in_RDI->super_IResultCapture);
  return;
}

Assistant:

RunContext::~RunContext() {
        m_reporter->testRunEnded(TestRunStats(m_runInfo, m_totals, aborting()));
    }